

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  ImGuiContext *pIVar2;
  bool bVar3;
  byte bVar4;
  ImU32 col;
  float fVar5;
  float fVar6;
  byte local_71;
  undefined1 auStack_4c [3];
  bool push_clip_rect;
  float r_surface;
  ImRect r;
  bool was_accepted_previously;
  ImGuiPayload *payload;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDragDropFlags flags_local;
  char *type_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  register0x00000000 = &GImGui->DragDropPayload;
  if ((GImGui->DragDropActive & 1U) == 0) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x341d,
                  "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
                 );
  }
  if ((GImGui->DragDropPayload).DataFrameCount != -1) {
    if ((type == (char *)0x0) || (bVar3 = ImGuiPayload::IsDataType(register0x00000000,type), bVar3))
    {
      r.Max.x._3_1_ = pIVar2->DragDropAcceptIdPrev == pIVar2->DragDropTargetId;
      _auStack_4c = (pIVar2->DragDropTargetRect).Min;
      r.Min = (pIVar2->DragDropTargetRect).Max;
      fVar5 = ImRect::GetWidth((ImRect *)auStack_4c);
      fVar6 = ImRect::GetHeight((ImRect *)auStack_4c);
      if (fVar5 * fVar6 < pIVar2->DragDropAcceptIdCurrRectSurface) {
        pIVar2->DragDropAcceptIdCurr = pIVar2->DragDropTargetId;
        pIVar2->DragDropAcceptIdCurrRectSurface = fVar5 * fVar6;
      }
      stack0xffffffffffffffc8->Preview = (bool)(r.Max.x._3_1_ & 1);
      if (((pIVar2->DragDropSourceFlags & 0x800U) == 0 && (flags & 0x800U) == 0) &&
         ((stack0xffffffffffffffc8->Preview & 1U) != 0)) {
        ImRect::Expand((ImRect *)auStack_4c,3.5);
        bVar3 = ImRect::Contains(&pIVar1->ClipRect,(ImRect *)auStack_4c);
        bVar4 = (bVar3 ^ 0xffU) & 1;
        if (bVar4 != 0) {
          ImDrawList::PushClipRectFullScreen(pIVar1->DrawList);
        }
        this = pIVar1->DrawList;
        col = GetColorU32(0x27,1.0);
        ImDrawList::AddRect(this,(ImVec2 *)auStack_4c,&r.Min,col,0.0,-1,2.0);
        if (bVar4 != 0) {
          ImDrawList::PopClipRect(pIVar1->DrawList);
        }
      }
      pIVar2->DragDropAcceptFrameCount = pIVar2->FrameCount;
      local_71 = 0;
      if ((r.Max.x._3_1_ & 1) != 0) {
        bVar3 = IsMouseDown(pIVar2->DragDropMouseButton);
        local_71 = bVar3 ^ 0xff;
      }
      stack0xffffffffffffffc8->Delivery = (bool)(local_71 & 1);
      if (((stack0xffffffffffffffc8->Delivery & 1U) == 0) && ((flags & 0x400U) == 0)) {
        type_local = (char *)0x0;
      }
      else {
        type_local = (char *)stack0xffffffffffffffc8;
      }
    }
    else {
      type_local = (char *)0x0;
    }
    return (ImGuiPayload *)type_local;
  }
  __assert_fail("payload.DataFrameCount != -1",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x341e,
                "const ImGuiPayload *ImGui::AcceptDragDropPayload(const char *, ImGuiDragDropFlags)"
               );
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface < g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAG: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRectFullScreen();
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, ~0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}